

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O0

void __thiscall QHttpNetworkReplyPrivate::removeAutoDecompressHeader(QHttpNetworkReplyPrivate *this)

{
  long lVar1;
  QByteArrayView name_00;
  QByteArrayView name_01;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  qint64 value;
  bool parseOk;
  QByteArray contentLength;
  QByteArrayView name;
  QHttpHeaderParser *this_00;
  QByteArray *defaultValue;
  QHttpHeaderParser *in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffffa0;
  byte bVar2;
  storage_type *in_stack_ffffffffffffffa8;
  bool local_30 [16];
  qsizetype qVar3;
  storage_type *psVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  psVar4 = (storage_type *)0xe;
  local_30[0] = true;
  local_30[1] = true;
  local_30[2] = true;
  local_30[3] = true;
  local_30[4] = true;
  local_30[5] = true;
  local_30[6] = true;
  local_30[7] = true;
  local_30[8] = true;
  local_30[9] = true;
  local_30[10] = true;
  local_30[0xb] = true;
  local_30[0xc] = true;
  local_30[0xd] = true;
  local_30[0xe] = true;
  local_30[0xf] = true;
  qVar3 = -0x5555555555555556;
  this_00 = (QHttpHeaderParser *)&in_RDI[5].d.size;
  defaultValue = in_RDI;
  QByteArray::QByteArray((QByteArray *)0x30523e);
  name_01.m_data = psVar4;
  name_01.m_size = qVar3;
  QHttpHeaderParser::firstHeaderField(in_stack_ffffffffffffff90,name_01,defaultValue);
  QByteArray::~QByteArray((QByteArray *)0x305266);
  bVar2 = 0;
  qVar3 = QByteArray::toLongLong(local_30,(int)&stack0xffffffffffffffa7);
  if ((bVar2 & 1) != 0) {
    in_RDI[0xe].d.size = qVar3;
    name_00.m_size._7_1_ = bVar2;
    name_00.m_size._0_7_ = in_stack_ffffffffffffffa0;
    name_00.m_data = in_stack_ffffffffffffffa8;
    QHttpHeaderParser::removeHeaderField(this_00,name_00);
  }
  QByteArray::~QByteArray((QByteArray *)0x3052d7);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpNetworkReplyPrivate::removeAutoDecompressHeader()
{
    // The header "Content-Encoding  = gzip" is retained.
    // Content-Length is removed since the actual one sent by the server is for compressed data
    constexpr auto name = QByteArrayView("content-length");
    QByteArray contentLength = parser.firstHeaderField(name);
    bool parseOk = false;
    qint64 value = contentLength.toLongLong(&parseOk);
    if (parseOk) {
        removedContentLength = value;
        parser.removeHeaderField(name);
    }
}